

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O1

void deqp::gls::StateQueryUtil::verifyIntegerVec4
               (ResultCollector *result,QueriedState *state,IVec4 *expected)

{
  ostream *str;
  ostringstream buf;
  string local_1b8;
  undefined1 local_198 [376];
  
  if ((state->m_type == DATATYPE_INTEGER_VEC4) &&
     (((((state->m_v).vInt != expected->m_data[0] ||
        ((state->m_v).vIntVec3[1] != expected->m_data[1])) ||
       ((state->m_v).vIntVec3[2] != expected->m_data[2])) ||
      ((state->m_v).vIntVec3[3] != expected->m_data[3])))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Expected ",9);
    str = tcu::operator<<((ostream *)local_198,expected);
    std::__ostream_insert<char,std::char_traits<char>>(str,", got ",6);
    local_1b8._M_dataplus._M_p = (pointer)&state->m_v;
    local_1b8._M_string_length._0_4_ = 4;
    tcu::Format::operator<<(str,(ArrayPointer<int> *)&local_1b8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  return;
}

Assistant:

void verifyIntegerVec4 (tcu::ResultCollector& result, QueriedState& state, const tcu::IVec4& expected)
{
	switch (state.getType())
	{
		case DATATYPE_INTEGER_VEC4:
		{
			if (state.getIntVec4Access()[0] != expected[0] ||
				state.getIntVec4Access()[1] != expected[1] ||
				state.getIntVec4Access()[2] != expected[2] ||
				state.getIntVec4Access()[3] != expected[3])
			{
				std::ostringstream buf;
				buf << "Expected " << expected << ", got " << tcu::formatArray(state.getIntVec4Access());
				result.fail(buf.str());
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}